

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

map_node_t ** map_getref(map_base_t *m,char *key)

{
  map_node_t *pmVar1;
  uint uVar2;
  int iVar3;
  map_node_t **ppmVar4;
  
  uVar2 = map_hash(key);
  if (m->nbuckets != 0) {
    ppmVar4 = m->buckets + (int)(m->nbuckets - 1 & uVar2);
    while (pmVar1 = *ppmVar4, pmVar1 != (map_node_t *)0x0) {
      if ((pmVar1->hash == uVar2) && (iVar3 = strcmp((char *)(pmVar1 + 1),key), iVar3 == 0)) {
        return ppmVar4;
      }
      ppmVar4 = &pmVar1->next;
    }
  }
  return (map_node_t **)0x0;
}

Assistant:

static map_node_t **map_getref(map_base_t *m, const char *key) {
  unsigned hash = map_hash(key);
  map_node_t **next;
  if (m->nbuckets > 0) {
    next = &m->buckets[map_bucketidx(m, hash)];
    while (*next) {
      if ((*next)->hash == hash && !strcmp((char*) (*next + 1), key)) {
        return next;
      }
      next = &(*next)->next;
    }
  }
  return NULL;
}